

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_tests.cpp
# Opt level: O2

MatrixXd *
eigs_speed_test(MatrixXd *__return_storage_ptr__,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *Nvec,size_t Nrepeats)

{
  undefined8 uVar1;
  Index rows;
  long lVar2;
  long lVar3;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *this;
  ulong i;
  size_t sVar4;
  bool bVar5;
  double elap_us;
  double maxeig;
  MatrixXd A;
  double local_b8;
  double local_b0;
  Scalar local_a8;
  void *local_a0 [3];
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> local_88;
  RandomReturnType local_68 [2];
  
  local_68[0].m_rows.m_value = *(long *)(Nvec + 8) - *(long *)Nvec >> 3;
  local_88.m_xpr._0_4_ = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,(unsigned_long *)local_68,
             (int *)&local_88);
  for (i = 0; i < (ulong)(*(long *)(Nvec + 8) - *(long *)Nvec >> 3); i = i + 1) {
    rows = *(Index *)(*(long *)Nvec + i * 8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Random(local_68,rows,rows);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a0,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)local_68);
    lVar2 = std::chrono::_V2::system_clock::now();
    sVar4 = Nrepeats;
    while (bVar5 = sVar4 != 0, sVar4 = sVar4 - 1, bVar5) {
      Eigen::internal::eigenvalues_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>::run
                ((eigenvalues_selector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_false> *)&local_88,
                 (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a0);
      local_68[0].m_rows.m_value = (long)&local_88;
      local_a8 = Eigen::
                 DenseBase<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>_>_>
                 ::minCoeff<0>((DenseBase<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>_>
                                *)local_68);
      free((void *)CONCAT44(local_88.m_xpr._4_4_,local_88.m_xpr._0_4_));
    }
    lVar3 = std::chrono::_V2::system_clock::now();
    local_b0 = (((double)(lVar3 - lVar2) / 1000000000.0) / (double)(long)Nrepeats) * 1000000.0;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_68,
               __return_storage_ptr__,i);
    uVar1 = *(undefined8 *)(*(long *)Nvec + i * 8);
    local_b8 = ((double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
    CommaInitializer(&local_88,
                     (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_68,
                     &local_b8);
    this = Eigen::
           CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
           operator_(&local_88,&local_b0);
    Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
    operator_(this,&local_a8);
    Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
    finished(&local_88);
    free(local_a0[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd eigs_speed_test(std::vector<std::size_t> &Nvec, std::size_t Nrepeats) {
    Eigen::MatrixXd results(Nvec.size(), 3);
    for (std::size_t i = 0; i < Nvec.size(); ++i)
    {
        Eigen::MatrixXd A = Eigen::MatrixXd::Random(Nvec[i], Nvec[i]);
        double maxeig;
        auto startTime = std::chrono::system_clock::now();
        for (int i = 0; i < Nrepeats; ++i) {
            maxeig = A.eigenvalues().real().minCoeff();
        }
        auto endTime = std::chrono::system_clock::now();
        auto elap_us = std::chrono::duration<double>(endTime - startTime).count() / Nrepeats*1e6;
        results.row(i) << static_cast<double>(Nvec[i]), elap_us, maxeig;
    }
    return results;
}